

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O0

ze_result_t __thiscall
tracing_layer::APITracerContextImp::enableTracingImp
          (APITracerContextImp *this,APITracerImp *tracerImp,ze_bool_t enable)

{
  tracingState_t tVar1;
  size_t sVar2;
  ostream *poVar3;
  ze_result_t local_2c;
  ze_result_t result;
  lock_guard<std::mutex> lock;
  APITracerImp *pAStack_18;
  ze_bool_t enable_local;
  APITracerImp *tracerImp_local;
  APITracerContextImp *this_local;
  
  lock._M_device._7_1_ = enable;
  pAStack_18 = tracerImp;
  tracerImp_local = (APITracerImp *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->traceTableMutex);
  tVar1 = pAStack_18->tracingState;
  if (tVar1 == disabledState) {
    if (lock._M_device._7_1_ != '\0') {
      std::__cxx11::
      list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::push_back
                (&this->enabledTracerImpList,&stack0xffffffffffffffe8);
      pAStack_18->tracingState = enabledState;
      updateTracerArrays(this);
    }
    local_2c = ZE_RESULT_SUCCESS;
  }
  else if (tVar1 == enabledState) {
    if (lock._M_device._7_1_ == '\0') {
      std::__cxx11::
      list<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>::remove
                (&this->enabledTracerImpList,(char *)&stack0xffffffffffffffe8);
      pAStack_18->tracingState = disabledWaitingState;
      sVar2 = updateTracerArrays(this);
      if (sVar2 == 0) {
        pAStack_18->tracingState = disabledState;
      }
    }
    local_2c = ZE_RESULT_SUCCESS;
  }
  else {
    if (tVar1 != disabledWaitingState) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Abort was called at ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x199);
      poVar3 = std::operator<<(poVar3," line in file: ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/source/layers/tracing/tracing_imp.cpp"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_2c = ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return local_2c;
}

Assistant:

ze_result_t
APITracerContextImp::enableTracingImp(struct APITracerImp *tracerImp,
                                      ze_bool_t enable) {
    std::lock_guard<std::mutex> lock(traceTableMutex);
    ze_result_t result;
    switch (tracerImp->tracingState) {
    case disabledState:
        if (enable) {
            enabledTracerImpList.push_back(tracerImp);
            tracerImp->tracingState = enabledState;
            updateTracerArrays();
        }
        result = ZE_RESULT_SUCCESS;
        break;

    case enabledState:
        if (!enable) {
            enabledTracerImpList.remove(tracerImp);
            tracerImp->tracingState = disabledWaitingState;
            if (updateTracerArrays() == 0)
                tracerImp->tracingState = disabledState;
        }
        result = ZE_RESULT_SUCCESS;
        break;

    case disabledWaitingState:
        result = ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
        break;

    default:
        result = ZE_RESULT_ERROR_UNINITIALIZED;
        UNRECOVERABLE_IF(true);
        break;
    }
    return result;
}